

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial_device.cpp
# Opt level: O0

float embree::getTextureTexel1f(Texture *texture,float s,float t)

{
  uint *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  uchar *t_1;
  int offset;
  float *data;
  int iv;
  int iu;
  uint local_28;
  uint local_24;
  float local_c;
  
  if (in_RDI == (uint *)0x0) {
    local_c = 0.0;
  }
  else {
    fVar1 = floorf(in_XMM0_Da * (float)*in_RDI);
    local_24 = (uint)(int)fVar1 % *in_RDI;
    if ((int)local_24 < 0) {
      local_24 = *in_RDI + local_24;
    }
    fVar1 = floorf(in_XMM1_Da * (float)in_RDI[1]);
    local_28 = (uint)(int)fVar1 % in_RDI[1];
    if ((int)local_28 < 0) {
      local_28 = in_RDI[1] + local_28;
    }
    if (in_RDI[2] == 3) {
      local_c = *(float *)(*(long *)(in_RDI + 6) + (ulong)(local_28 * *in_RDI + local_24) * 4);
    }
    else if (in_RDI[2] == 1) {
      local_c = (float)*(byte *)(*(long *)(in_RDI + 6) +
                                (long)(int)((local_28 * *in_RDI + local_24) * 4)) * 0.003921569;
    }
    else {
      local_c = 0.0;
    }
  }
  return local_c;
}

Assistant:

float getTextureTexel1f(const Texture* texture, float s, float t)
{
  if (!texture) return 0.0f;

  int iu = (int)floor(s * (float)(texture->width));
  iu = iu % texture->width; if (iu < 0) iu += texture->width;
  int iv = (int)floor(t * (float)(texture->height));
  iv = iv % texture->height; if (iv < 0) iv += texture->height;

  if (texture->format == Texture::FLOAT32)
  {
    float *data = (float *)texture->data;
    return data[iv*texture->width + iu];
  }
  else if (texture->format == Texture::RGBA8)
  {
    const int offset = (iv * texture->width + iu) * 4;
    unsigned char * t = (unsigned char*)texture->data;
    return t[offset+0]*(1.0f/255.0f);
  }
  return 0.0f;
}